

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveSkip::writeTempData(CDirectiveSkip *this,TempData *tempData)

{
  int64_t memoryAddress;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  CDirectiveSkip *this_local;
  
  memoryAddress = this->virtualAddress;
  local_18 = tempData;
  tempData_local = (TempData *)this;
  tinyformat::format<long>(&local_38,".skip 0x%08X",&this->value);
  TempData::writeLine(tempData,memoryAddress,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void CDirectiveSkip::writeTempData(TempData& tempData) const
{
	tempData.writeLine(virtualAddress,tfm::format(".skip 0x%08X",value));
}